

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Pipeline * __thiscall
capnp::AnyPointer::Pipeline::noop(Pipeline *__return_storage_ptr__,Pipeline *this)

{
  bool bVar1;
  size_t size;
  unsigned_long *puVar2;
  PipelineOp *pPVar3;
  PipelineOp *pPVar4;
  PipelineHook *pPVar5;
  Array<capnp::PipelineOp> *ops;
  Own<capnp::PipelineHook,_std::nullptr_t> local_80;
  size_t local_70;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> local_48;
  Range<unsigned_long> *local_38;
  Range<unsigned_long> *__range1;
  Array<capnp::PipelineOp> newOps;
  Pipeline *this_local;
  
  newOps.disposer = (ArrayDisposer *)this;
  size = kj::Array<capnp::PipelineOp>::size(&this->ops);
  kj::heapArray<capnp::PipelineOp>((Array<capnp::PipelineOp> *)&__range1,size);
  local_48 = kj::indices<kj::Array<capnp::PipelineOp>&>(&this->ops);
  local_38 = &local_48;
  __end1 = kj::Range<unsigned_long>::begin(local_38);
  i = (unsigned_long)kj::Range<unsigned_long>::end(local_38);
  while( true ) {
    bVar1 = kj::Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
    local_70 = *puVar2;
    pPVar3 = kj::Array<capnp::PipelineOp>::operator[](&this->ops,local_70);
    pPVar4 = kj::Array<capnp::PipelineOp>::operator[]
                       ((Array<capnp::PipelineOp> *)&__range1,local_70);
    *pPVar4 = *pPVar3;
    kj::Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  pPVar5 = kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator->(&this->hook);
  (**pPVar5->_vptr_PipelineHook)(&local_80);
  ops = kj::mv<kj::Array<capnp::PipelineOp>>((Array<capnp::PipelineOp> *)&__range1);
  Pipeline(__return_storage_ptr__,&local_80,ops);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_80);
  kj::Array<capnp::PipelineOp>::~Array((Array<capnp::PipelineOp> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline AnyPointer::Pipeline::noop() {
  auto newOps = kj::heapArray<PipelineOp>(ops.size());
  for (auto i: kj::indices(ops)) {
    newOps[i] = ops[i];
  }
  return Pipeline(hook->addRef(), kj::mv(newOps));
}